

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O2

ptr<resp_msg> __thiscall nuraft::FakeNetwork::gotMsg(FakeNetwork *this,ptr<req_msg> *msg)

{
  element_type *peVar1;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<resp_msg> pVar2;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  peVar1 = msg[5].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  (*(peVar1->super_msg_base)._vptr_msg_base[2])(this,peVar1,*in_RDX);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  pVar2.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar2.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> FakeNetwork::gotMsg(ptr<req_msg>& msg) {
    ptr<resp_msg> resp = raft_server_handler::process_req(handler.get(), *msg);
    return resp;
}